

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcUShapeProfileDef::~IfcUShapeProfileDef(IfcUShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  this[-1].FlangeWidth = 5.00027239550225e-317;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x9a6e00;
  puVar1 = *(undefined1 **)&this[-1].EdgeRadius.have;
  if ((bool *)puVar1 != &this[-1].FlangeSlope.have) {
    operator_delete(puVar1);
  }
  if ((bool *)this[-1].FlangeThickness != &this[-1].FilletRadius.have) {
    operator_delete((undefined1 *)this[-1].FlangeThickness);
  }
  operator_delete(&this[-1].FlangeWidth);
  return;
}

Assistant:

IfcUShapeProfileDef() : Object("IfcUShapeProfileDef") {}